

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O1

void __thiscall
spirv_cross::
SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>::
push_back(SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
          *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *t)

{
  size_t *psVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  size_t sVar3;
  pointer pcVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  
  reserve(this,(this->
               super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ).buffer_size + 1);
  pbVar2 = (this->
           super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ).ptr;
  sVar3 = (this->
          super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ).buffer_size;
  pbVar5 = pbVar2 + sVar3;
  (pbVar5->_M_dataplus)._M_p = (pointer)&pbVar5->field_2;
  pcVar4 = (t->_M_dataplus)._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)(pbVar2 + sVar3),pcVar4,pcVar4 + t->_M_string_length);
  psVar1 = &(this->
            super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ).buffer_size;
  *psVar1 = *psVar1 + 1;
  return;
}

Assistant:

void push_back(const T &t) SPIRV_CROSS_NOEXCEPT
	{
		reserve(this->buffer_size + 1);
		new (&this->ptr[this->buffer_size]) T(t);
		this->buffer_size++;
	}